

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O2

int testMMapFileReaderTestsReadStruct(void)

{
  Span<unsigned_short,_3UL> data;
  bool bVar1;
  string *psVar2;
  uint64_t uVar3;
  ostream *poVar4;
  char *pcVar5;
  MMapFileReader reader;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  reader.m_mmap._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
  super__Head_base<1UL,_std::function<void_(void_*)>,_false>._M_head_impl.super__Function_base.
  _M_functor._4_2_ = 0x1e;
  reader.m_mmap._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
  super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
  super__Head_base<1UL,_std::function<void_(void_*)>,_false>._M_head_impl.super__Function_base.
  _M_functor._0_4_ = 0x14000a;
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  data.m_ptr._4_2_ =
       reader.m_mmap._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
       super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
       super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
       super__Head_base<1UL,_std::function<void_(void_*)>,_false>._M_head_impl.super__Function_base.
       _M_functor._4_2_;
  data.m_ptr._0_4_ =
       reader.m_mmap._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
       super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
       super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
       super__Head_base<1UL,_std::function<void_(void_*)>,_false>._M_head_impl.super__Function_base.
       _M_functor._0_4_;
  data._6_10_ = reader.m_mmap._M_t.super___uniq_ptr_impl<void,_std::function<void_(void_*)>_>._M_t.
                super__Tuple_impl<0UL,_void_*,_std::function<void_(void_*)>_>.
                super__Tuple_impl<1UL,_std::function<void_(void_*)>_>.
                super__Head_base<1UL,_std::function<void_(void_*)>,_false>._M_head_impl.
                super__Function_base._M_functor._6_10_;
  MILBlob::TestUtil::WriteBlobFile<unsigned_short,3ul>(psVar2,data);
  psVar2 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&reader,psVar2);
  uVar3 = MILBlob::Blob::MMapFileReader::GetLength(&reader);
  if (uVar3 == 6) {
    bVar1 = MILBlob::Blob::MMapFileReader::IsEncrypted(&reader);
    if (!bVar1) {
      MILBlob::Blob::MMapFileReader::ReadStruct<testMMapFileReaderTestsReadStruct()::Int16Data>
                (&reader,6);
      poVar4 = std::operator<<((ostream *)&std::clog,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x65);
      std::operator<<(poVar4,": expected exception, but none thrown.\n");
      goto LAB_00175623;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x58);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar5 = "!(reader.IsEncrypted())";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar5 = "(reader.GetLength()) == (uint64_t(6))";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_00175623:
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&reader);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testMMapFileReaderTestsReadStruct()
{
    AutoDeleteTempFile tempfile;

    {
        std::array<uint16_t, 3> values{10, 20, 30};
        TestUtil::WriteBlobFile(tempfile.GetFilename(), Util::MakeSpan(values));
    }

    MMapFileReader reader(tempfile.GetFilename());
    ML_ASSERT_EQ(reader.GetLength(), uint64_t(6));
    ML_ASSERT_NOT(reader.IsEncrypted());

    struct Int16Data {
        uint16_t a;
        uint16_t b;
    };

    struct Int64Data {
        uint64_t a;
        uint64_t b;
    };

    // test invalid offsets/lengths
    ML_ASSERT_THROWS(reader.ReadStruct<Int16Data>(6), std::range_error);
    ML_ASSERT_THROWS(reader.ReadStruct<Int64Data>(0), std::range_error);

    {
        const Int16Data& data = reader.ReadStruct<Int16Data>(2);
        ML_ASSERT_EQ(data.a, 20);
        ML_ASSERT_EQ(data.b, 30);
    }

    return 0;
}